

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynNamespaceElement * __thiscall
ParseContext::IsNamespace(ParseContext *this,SynNamespaceElement *parent,InplaceStr name)

{
  SynNamespaceElement *pSVar1;
  InplaceStr name_00;
  bool bVar2;
  SynNamespaceElement **ppSVar3;
  SynNamespaceElement *pSVar4;
  uint i;
  uint uVar5;
  InplaceStr local_40;
  
  local_40.end = name.end;
  local_40.begin = name.begin;
  if (parent == (SynNamespaceElement *)0x0) {
    pSVar4 = (SynNamespaceElement *)&this->currentNamespace;
    do {
      pSVar4 = pSVar4->parent;
      for (uVar5 = 0; uVar5 < (this->namespaceList).count; uVar5 = uVar5 + 1) {
        ppSVar3 = SmallArray<SynNamespaceElement_*,_32U>::operator[](&this->namespaceList,uVar5);
        pSVar1 = *ppSVar3;
        if ((pSVar1->parent == pSVar4) &&
           (bVar2 = InplaceStr::operator==(&pSVar1->name->name,&local_40), bVar2)) {
          return pSVar1;
        }
      }
    } while (pSVar4 != (SynNamespaceElement *)0x0);
  }
  else {
    for (uVar5 = 0; uVar5 < (this->namespaceList).count; uVar5 = uVar5 + 1) {
      ppSVar3 = SmallArray<SynNamespaceElement_*,_32U>::operator[](&this->namespaceList,uVar5);
      pSVar4 = *ppSVar3;
      if ((pSVar4->parent == parent) &&
         (bVar2 = InplaceStr::operator==(&pSVar4->name->name,&local_40), bVar2)) {
        return pSVar4;
      }
    }
    if (parent->parent != (SynNamespaceElement *)0x0) {
      name_00.end = local_40.end;
      name_00.begin = local_40.begin;
      pSVar4 = IsNamespace(this,parent->parent,name_00);
      return pSVar4;
    }
  }
  return (SynNamespaceElement *)0x0;
}

Assistant:

SynNamespaceElement* ParseContext::IsNamespace(SynNamespaceElement *parent, InplaceStr name)
{
	// In the context of a parent namespace, we only look for immediate children
	if(parent)
	{
		// Search for existing namespace in the same context
		for(unsigned i = 0; i < namespaceList.size(); i++)
		{
			SynNamespaceElement *ns = namespaceList[i];

			if(ns->parent == parent && ns->name->name == name)
				return ns;
		}

		// Try from context of the parent namespace
		if(parent->parent)
			return IsNamespace(parent->parent, name);

		return NULL;
	}

	// Go from the bottom of the namespace stack, trying to find the namespace there
	SynNamespaceElement *current = currentNamespace;

	for(;;)
	{
		for(unsigned i = 0; i < namespaceList.size(); i++)
		{
			SynNamespaceElement *ns = namespaceList[i];

			if(ns->parent == current && ns->name->name == name)
				return ns;
		}

		if(current)
			current = current->parent;
		else
			break;
	}

	return NULL;
}